

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

bool __thiscall fmcalc::loadcoverages(fmcalc *this,vector<float,_std::allocator<float>_> *coverages)

{
  long *plVar1;
  FILE *__stream;
  ulong uVar2;
  size_t sVar3;
  long *plVar4;
  long lVar5;
  OASIS_FLOAT tiv;
  string file;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  char *local_68 [2];
  char local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"input/coverages.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_68);
    plVar1 = (long *)std::__cxx11::string::replace
                               ((ulong)local_48,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar1[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar1;
    }
    local_80 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  __stream = fopen(local_68[0],"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    fseek(__stream,0,0);
    std::vector<float,_std::allocator<float>_>::resize(coverages,(uVar2 >> 2) + 1);
    lVar5 = 4;
    sVar3 = fread(&local_88,4,1,__stream);
    while (sVar3 != 0) {
      *(undefined4 *)
       ((long)(coverages->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar5) = local_88._0_4_;
      sVar3 = fread(&local_88,4,1,__stream);
      lVar5 = lVar5 + 4;
    }
    fclose(__stream);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool fmcalc::loadcoverages(std::vector<OASIS_FLOAT> &coverages)
{

	FILE *fin = NULL;
	std::string file = COVERAGES_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) return false;

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	size_t nrec = sz / sizeof(tiv);

	coverages.resize(nrec + 1);
	int coverage_id = 0;
	size_t i = fread(&tiv, sizeof(tiv), 1, fin);
	while (i != 0) {
		coverage_id++;
		coverages[coverage_id] = tiv;
		i = fread(&tiv, sizeof(tiv), 1, fin);
	}

	fclose(fin);
	return true;

}